

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall QPDF::addPage(QPDF *this,QPDFObjectHandle *newpage,bool first)

{
  int pos;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [32];
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  undefined1 local_19;
  QPDFObjectHandle *pQStack_18;
  bool first_local;
  QPDFObjectHandle *newpage_local;
  QPDF *this_local;
  
  local_19 = first;
  pQStack_18 = newpage;
  newpage_local = (QPDFObjectHandle *)this;
  if (first) {
    QPDFObjectHandle::QPDFObjectHandle(&local_30,newpage);
    insertPage(this,&local_30,0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  }
  else {
    QPDFObjectHandle::QPDFObjectHandle(local_50,newpage);
    getRoot((QPDF *)local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Pages",&local_a1);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_80 + 0x10),(string *)local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"/Count",&local_c9);
    QPDFObjectHandle::getKey(&local_60,(string *)(local_80 + 0x10));
    pos = QPDFObjectHandle::getIntValueAsInt(&local_60);
    insertPage(this,local_50,pos);
    QPDFObjectHandle::~QPDFObjectHandle(&local_60);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_80 + 0x10));
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
    QPDFObjectHandle::~QPDFObjectHandle(local_50);
  }
  return;
}

Assistant:

void
QPDF::addPage(QPDFObjectHandle newpage, bool first)
{
    if (first) {
        insertPage(newpage, 0);
    } else {
        insertPage(newpage, getRoot().getKey("/Pages").getKey("/Count").getIntValueAsInt());
    }
}